

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zetDebugGetRegisterSetProperties
          (zet_device_handle_t hDevice,uint32_t *pCount,
          zet_debug_regset_properties_t *pRegisterSetProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010d960 != (code *)0x0) {
    zVar1 = (*DAT_0010d960)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugGetRegisterSetProperties(
        zet_device_handle_t hDevice,                    ///< [in] device handle
        uint32_t* pCount,                               ///< [in,out] pointer to the number of register set properties.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of register set properties available.
                                                        ///< if count is greater than the number of register set properties
                                                        ///< available, then the driver shall update the value with the correct
                                                        ///< number of registry set properties available.
        zet_debug_regset_properties_t* pRegisterSetProperties   ///< [in,out][optional][range(0, *pCount)] array of query results for
                                                        ///< register set properties.
                                                        ///< if count is less than the number of register set properties available,
                                                        ///< then driver shall only retrieve that number of register set properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetRegisterSetProperties = context.zetDdiTable.Debug.pfnGetRegisterSetProperties;
        if( nullptr != pfnGetRegisterSetProperties )
        {
            result = pfnGetRegisterSetProperties( hDevice, pCount, pRegisterSetProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }